

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void pcut_print_items(pcut_item_t *first)

{
  char *pcVar1;
  char *__format;
  
  puts("====>");
  do {
    if (first == (pcut_item_t *)0x0) {
      puts("----");
      return;
    }
    switch(first->kind) {
    case 0:
      break;
    case 1:
      puts("NESTED ...");
      break;
    default:
      printf("UNKNOWN (%d)\n");
      break;
    case 4:
      pcVar1 = first->name;
      __format = "SUITE %s\n";
      goto LAB_001037db;
    case 5:
      pcVar1 = first->name;
      __format = "TEST %s\n";
LAB_001037db:
      printf(__format,pcVar1);
    }
    first = first->next;
  } while( true );
}

Assistant:

void pcut_print_items(pcut_item_t *first) {
	pcut_item_t *it = first;
	printf("====>\n");
	while (it != NULL) {
		switch (it->kind) {
		case PCUT_KIND_TEST:
			printf("TEST %s\n", it->name);
			break;
		case PCUT_KIND_TESTSUITE:
			printf("SUITE %s\n", it->name);
			break;
		case PCUT_KIND_SKIP:
			break;
		case PCUT_KIND_NESTED:
			printf("NESTED ...\n");
			break;
		default:
			printf("UNKNOWN (%d)\n", it->kind);
			break;
		}
		it = it->next;
	}
	printf("----\n");
}